

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderFunctions.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::CallCountScanner::create(CallCountScanner *this)

{
  unordered_map<wasm::Name,_std::atomic<unsigned_int>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>_>
  *local_20;
  
  std::
  make_unique<wasm::CallCountScanner,std::unordered_map<wasm::Name,std::atomic<unsigned_int>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::atomic<unsigned_int>>>>*&>
            (&local_20);
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)local_20;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<CallCountScanner>(counts);
  }